

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar4;
  undefined4 extraout_var;
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0x162) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
    uVar1 = data->R0;
    uVar2 = data->R1;
    pPVar4 = FunctionProxy::EnsureDeserialized(this);
    iVar3 = (*(pPVar4->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar4);
    Output::Print(L" R%d, R%d = %s()",(ulong)uVar1,(ulong)uVar2,CONCAT44(extraout_var,iVar3));
    return;
  }
  DumpReg(data->R0);
  DumpReg(data->R1);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg2U(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitBaseClass:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d, R%d = %s()"), data->R0, data->R1, pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }

            default:
                DumpReg(data->R0);
                DumpReg(data->R1);
                break;
        }
    }